

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround
          (CompilerGLSL *this,string *func,Op op,GroupOperation group_op)

{
  bool bVar1;
  CompilerError *pCVar2;
  reference ts;
  bool local_dd2;
  bool local_dd1;
  TypeInfo *t;
  iterator __end1;
  iterator __begin1;
  vector<TypeInfo,_std::allocator<TypeInfo>_> *__range1;
  string op_symbol;
  undefined1 local_960 [3];
  bool op_is_multiplication;
  bool op_is_addition;
  string local_940 [37];
  undefined1 local_91b;
  allocator local_91a;
  allocator local_919;
  TypeInfo local_918;
  undefined1 local_8d3;
  allocator local_8d2;
  allocator local_8d1;
  TypeInfo local_8d0;
  undefined1 local_88b;
  allocator local_88a;
  allocator local_889;
  TypeInfo local_888;
  undefined1 local_843;
  allocator local_842;
  allocator local_841;
  TypeInfo local_840;
  undefined1 local_7fb;
  allocator local_7fa;
  allocator local_7f9;
  TypeInfo local_7f8;
  undefined1 local_7b3;
  allocator local_7b2;
  allocator local_7b1;
  TypeInfo local_7b0;
  undefined1 local_76b;
  allocator local_76a;
  allocator local_769;
  TypeInfo local_768;
  undefined1 local_723;
  allocator local_722;
  allocator local_721;
  TypeInfo local_720;
  undefined1 local_6db;
  allocator local_6da;
  allocator local_6d9;
  TypeInfo local_6d8;
  undefined1 local_693;
  allocator local_692;
  allocator local_691;
  TypeInfo local_690;
  undefined1 local_64b;
  allocator local_64a;
  allocator local_649;
  TypeInfo local_648;
  undefined1 local_603;
  allocator local_602;
  allocator local_601;
  TypeInfo local_600;
  undefined1 local_5bb;
  allocator local_5ba;
  allocator local_5b9;
  TypeInfo local_5b8;
  undefined1 local_573;
  allocator local_572;
  allocator local_571;
  TypeInfo local_570;
  undefined1 local_52b;
  allocator local_52a;
  allocator local_529;
  TypeInfo local_528;
  undefined1 local_4e3;
  allocator local_4e2;
  allocator local_4e1;
  TypeInfo local_4e0;
  undefined1 local_49b;
  allocator local_49a;
  allocator local_499;
  TypeInfo local_498;
  undefined1 local_453;
  allocator local_452;
  allocator local_451;
  TypeInfo local_450;
  undefined1 local_40b;
  allocator local_40a;
  allocator local_409;
  TypeInfo local_408;
  undefined1 local_3c3;
  allocator local_3c2;
  allocator local_3c1;
  TypeInfo local_3c0;
  undefined1 local_37b;
  allocator local_37a;
  allocator local_379;
  TypeInfo local_378;
  undefined1 local_333;
  allocator local_332;
  allocator local_331;
  TypeInfo local_330;
  undefined1 local_2eb;
  allocator local_2ea;
  allocator local_2e9;
  TypeInfo local_2e8;
  undefined1 local_2a3;
  allocator local_2a2;
  allocator local_2a1;
  TypeInfo local_2a0;
  undefined1 local_25b;
  allocator local_25a;
  allocator local_259;
  TypeInfo local_258;
  undefined1 local_213;
  allocator local_212;
  allocator local_211;
  TypeInfo local_210;
  undefined1 local_1cb;
  allocator local_1ca;
  allocator local_1c9;
  TypeInfo local_1c8;
  undefined1 local_183;
  allocator local_182;
  allocator local_181;
  TypeInfo local_180;
  undefined1 local_13b;
  allocator local_13a;
  allocator local_139;
  TypeInfo local_138;
  undefined1 local_f3;
  allocator local_f2;
  allocator local_f1;
  TypeInfo local_f0;
  undefined1 local_ab;
  allocator local_aa;
  allocator local_a9;
  TypeInfo local_a8;
  undefined1 local_68 [8];
  vector<TypeInfo,_std::allocator<TypeInfo>_> type_infos;
  undefined1 local_40 [8];
  string result;
  GroupOperation group_op_local;
  Op op_local;
  string *func_local;
  CompilerGLSL *this_local;
  
  result.field_2._8_4_ = group_op;
  result.field_2._12_4_ = op;
  ::std::__cxx11::string::string((string *)local_40);
  if (result.field_2._8_4_ == 0) {
    ::std::__cxx11::string::operator=((string *)local_40,"reduction");
  }
  else if (result.field_2._8_4_ == 1) {
    ::std::__cxx11::string::operator=((string *)local_40,"incl_scan");
  }
  else {
    if (result.field_2._8_4_ != 2) {
      pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar2,"Unsupported workaround for arithmetic group operation");
      __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::__cxx11::string::operator=((string *)local_40,"excl_scan");
  }
  ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::vector
            ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_68);
  switch(result.field_2._12_4_) {
  case 0x15d:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8,"uint",&local_a9);
    local_ab = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a8.identity,"0u",&local_aa);
    local_ab = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_a8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_a8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_aa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0,"uvec2",&local_f1);
    local_f3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_f0.identity,"uvec2(0u)",&local_f2);
    local_f3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_f0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_138,"uvec3",&local_139);
    local_13b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_138.identity,"uvec3(0u)",&local_13a);
    local_13b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_138);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_138);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_13a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_139);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_180,"uvec4",&local_181);
    local_183 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_180.identity,"uvec4(0u)",&local_182);
    local_183 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_180);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_180);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_182);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_181);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1c8,"int",&local_1c9);
    local_1cb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_1c8.identity,"0",&local_1ca);
    local_1cb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_1c8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_1c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1ca);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_210,"ivec2",&local_211);
    local_213 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_210.identity,"ivec2(0)",&local_212);
    local_213 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_210);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_210);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_212);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_211);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_258,"ivec3",&local_259);
    local_25b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_258.identity,"ivec3(0)",&local_25a);
    local_25b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_258);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_258);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_25a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2a0,"ivec4",&local_2a1);
    local_2a3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2a0.identity,"ivec4(0)",&local_2a2);
    local_2a3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_2a0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_2a0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
    break;
  case 0x15e:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2e8,"float",&local_2e9);
    local_2eb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_2e8.identity,"0.0f",&local_2ea);
    local_2eb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_2e8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_2e8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2ea);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_330,"vec2",&local_331);
    local_333 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_330.identity,"vec2(0.0f)",&local_332);
    local_333 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_330);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_330);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_332);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_331);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_378,"vec3",&local_379);
    local_37b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_378.identity,"vec3(0.0f)",&local_37a);
    local_37b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_378);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_378);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_37a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_379);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3c0,"vec4",&local_3c1);
    local_3c3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3c0.identity,"vec4(0.0f)",&local_3c2);
    local_3c3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_3c0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_3c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_408,"double",&local_409);
    local_40b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_408.identity,"0.0LF",&local_40a);
    local_40b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_408);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_408);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_40a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_409);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_450,"dvec2",&local_451);
    local_453 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_450.identity,"dvec2(0.0LF)",&local_452);
    local_453 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_450);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_450);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_452);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_451);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_498,"dvec3",&local_499);
    local_49b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_498.identity,"dvec3(0.0LF)",&local_49a);
    local_49b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_498);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_498);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_49a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_499);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4e0,"dvec4",&local_4e1);
    local_4e3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_4e0.identity,"dvec4(0.0LF)",&local_4e2);
    local_4e3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_4e0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_4e0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4e2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_4e1);
    break;
  case 0x15f:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_528,"uint",&local_529);
    local_52b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_528.identity,"1u",&local_52a);
    local_52b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_528);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_528);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_52a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_529);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_570,"uvec2",&local_571);
    local_573 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_570.identity,"uvec2(1u)",&local_572);
    local_573 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_570);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_570);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_572);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_571);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5b8,"uvec3",&local_5b9);
    local_5bb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_5b8.identity,"uvec3(1u)",&local_5ba);
    local_5bb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_5b8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_5b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5ba);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_600,"uvec4",&local_601);
    local_603 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_600.identity,"uvec4(1u)",&local_602);
    local_603 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_600);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_600);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_602);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_601);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_648,"int",&local_649);
    local_64b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_648.identity,"1",&local_64a);
    local_64b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_648);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_648);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_64a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_649);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_690,"ivec2",&local_691);
    local_693 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_690.identity,"ivec2(1)",&local_692);
    local_693 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_690);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_690);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_692);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_691);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6d8,"ivec3",&local_6d9);
    local_6db = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_6d8.identity,"ivec3(1)",&local_6da);
    local_6db = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_6d8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_6d8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6da);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_720,"ivec4",&local_721);
    local_723 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_720.identity,"ivec4(1)",&local_722);
    local_723 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_720);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_720);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_722);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_721);
    break;
  case 0x160:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_768,"float",&local_769);
    local_76b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_768.identity,"1.0f",&local_76a);
    local_76b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_768);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_768);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_76a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_769);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7b0,"vec2",&local_7b1);
    local_7b3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7b0.identity,"vec2(1.0f)",&local_7b2);
    local_7b3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_7b0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_7b0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7b2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7f8,"vec3",&local_7f9);
    local_7fb = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_7f8.identity,"vec3(1.0f)",&local_7fa);
    local_7fb = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_7f8);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_7f8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7fa);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7f9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_840,"vec4",&local_841);
    local_843 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_840.identity,"vec4(1.0f)",&local_842);
    local_843 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_840);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_840);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_842);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_841);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_888,"double",&local_889);
    local_88b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_888.identity,"0.0LF",&local_88a);
    local_88b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_888);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_888);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_88a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_889);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8d0,"dvec2",&local_8d1);
    local_8d3 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_8d0.identity,"dvec2(1.0LF)",&local_8d2);
    local_8d3 = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_8d0);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_8d0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8d2);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_8d1);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_918,"dvec3",&local_919);
    local_91b = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_918.identity,"dvec3(1.0LF)",&local_91a);
    local_91b = 0;
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,&local_918);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo(&local_918);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_91a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_919);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)local_960,"dvec4",(allocator *)(op_symbol.field_2._M_local_buf + 0xf));
    op_symbol.field_2._M_local_buf[0xd] = '\x01';
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_940,"dvec4(1.0LF)",(allocator *)(op_symbol.field_2._M_local_buf + 0xe));
    op_symbol.field_2._M_local_buf[0xd] = '\0';
    ::std::
    vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
    ::
    emplace_back<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>
              ((vector<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo,std::allocator<spirv_cross::CompilerGLSL::emit_subgroup_arithmetic_workaround(std::__cxx11::string_const&,spv::Op,spv::GroupOperation)::TypeInfo>>
                *)local_68,(TypeInfo *)local_960);
    emit_subgroup_arithmetic_workaround::TypeInfo::~TypeInfo((TypeInfo *)local_960);
    ::std::allocator<char>::~allocator((allocator<char> *)(op_symbol.field_2._M_local_buf + 0xe));
    ::std::allocator<char>::~allocator((allocator<char> *)(op_symbol.field_2._M_local_buf + 0xf));
    break;
  default:
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar2,"Unsupported workaround for arithmetic group operation");
    __cxa_throw(pCVar2,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  local_dd1 = result.field_2._12_4_ == 0x15d || result.field_2._12_4_ == 0x15e;
  op_symbol.field_2._M_local_buf[0xc] = local_dd1;
  local_dd2 = result.field_2._12_4_ == 0x15f || result.field_2._12_4_ == 0x160;
  op_symbol.field_2._M_local_buf[0xb] = local_dd2;
  ::std::__cxx11::string::string((string *)&__range1);
  if ((op_symbol.field_2._M_local_buf[0xc] & 1U) == 0) {
    if ((op_symbol.field_2._M_local_buf[0xb] & 1U) != 0) {
      ::std::__cxx11::string::operator=((string *)&__range1,"*=");
    }
  }
  else {
    ::std::__cxx11::string::operator=((string *)&__range1,"+=");
  }
  __end1 = ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::begin
                     ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_68);
  t = (TypeInfo *)
      ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::end
                ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_68);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>
                                     *)&t), bVar1) {
    ts = __gnu_cxx::__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>
         ::operator*(&__end1);
    statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[4]>
              (this,&ts->type,(char (*) [2])0x57fa85,func,(char (*) [2])0x5ac375,&ts->type,
               (char (*) [4])0x5972df);
    begin_scope(this);
    statement<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
              (this,&ts->type,(char (*) [2])0x57fa85,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [4])0x5abcd8,&ts->identity,(char (*) [2])0x5abb6c);
    statement<char_const(&)[45]>(this,(char (*) [45])"uvec4 active_threads = subgroupBallot(true);")
    ;
    statement<char_const(&)[63]>
              (this,(char (*) [63])"if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)")
    ;
    begin_scope(this);
    statement<char_const(&)[35]>(this,(char (*) [35])"uint total = gl_SubgroupSize / 2u;");
    statement<std::__cxx11::string&,char_const(&)[6]>
              (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [6])" = v;");
    statement<char_const(&)[40]>(this,(char (*) [40])"for (uint i = 1u; i <= total; i <<= 1u)");
    begin_scope(this);
    statement<char_const(&)[12]>(this,(char (*) [12])"bool valid;");
    if (result.field_2._8_4_ == 0) {
      statement<std::__cxx11::string_const&,char_const(&)[19],std::__cxx11::string&,char_const(&)[30]>
                (this,&ts->type,(char (*) [19])" s = shuffleXorNV(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [30])", i, gl_SubgroupSize, valid);");
    }
    else if ((result.field_2._8_4_ == 2) || (result.field_2._8_4_ == 1)) {
      statement<std::__cxx11::string_const&,char_const(&)[18],std::__cxx11::string&,char_const(&)[30]>
                (this,&ts->type,(char (*) [18])" s = shuffleUpNV(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [30])", i, gl_SubgroupSize, valid);");
    }
    if (((op_symbol.field_2._M_local_buf[0xc] & 1U) != 0) ||
       ((op_symbol.field_2._M_local_buf[0xb] & 1U) != 0)) {
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [2])0x57fa85,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (char (*) [14])" valid ? s : ",&ts->identity,(char (*) [2])0x5abb6c);
    }
    end_scope(this);
    if (result.field_2._8_4_ == 2) {
      statement<std::__cxx11::string&,char_const(&)[16],std::__cxx11::string&,char_const(&)[24]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [16])0x5b1571,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [24])", 1u, gl_SubgroupSize);");
      statement<char_const(&)[21]>(this,(char (*) [21])"if (subgroupElect())");
      begin_scope(this);
      statement<std::__cxx11::string&,char_const(&)[4],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [4])0x5abcd8,&ts->identity,(char (*) [2])0x5abb6c);
      end_scope(this);
    }
    end_scope(this);
    statement<char_const(&)[5]>(this,(char (*) [5])0x5aed7c);
    begin_scope(this);
    if (result.field_2._8_4_ == 2) {
      statement<char_const(&)[56]>
                (this,(char (*) [56])"uint total = subgroupBallotBitCount(gl_SubgroupLtMask);");
    }
    else if (result.field_2._8_4_ == 1) {
      statement<char_const(&)[56]>
                (this,(char (*) [56])"uint total = subgroupBallotBitCount(gl_SubgroupLeMask);");
    }
    statement<char_const(&)[44]>(this,(char (*) [44])"for (uint i = 0u; i < gl_SubgroupSize; ++i)");
    begin_scope(this);
    statement<char_const(&)[58]>
              (this,(char (*) [58])"bool valid = subgroupBallotBitExtract(active_threads, i);");
    statement<std::__cxx11::string_const&,char_const(&)[39]>
              (this,&ts->type,(char (*) [39])" s = shuffleNV(v, i, gl_SubgroupSize);");
    if ((result.field_2._8_4_ == 2) || (result.field_2._8_4_ == 1)) {
      statement<char_const(&)[30]>(this,(char (*) [30])"valid = valid && (i < total);");
    }
    if (((op_symbol.field_2._M_local_buf[0xc] & 1U) != 0) ||
       ((op_symbol.field_2._M_local_buf[0xb] & 1U) != 0)) {
      statement<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char_const(&)[2]>
                (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (char (*) [2])0x57fa85,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
                 (char (*) [14])" valid ? s : ",&ts->identity,(char (*) [2])0x5abb6c);
    }
    end_scope(this);
    end_scope(this);
    statement<char_const(&)[8],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [8])"return ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5abb6c);
    end_scope(this);
    __gnu_cxx::__normal_iterator<TypeInfo_*,_std::vector<TypeInfo,_std::allocator<TypeInfo>_>_>::
    operator++(&__end1);
  }
  ::std::__cxx11::string::~string((string *)&__range1);
  ::std::vector<TypeInfo,_std::allocator<TypeInfo>_>::~vector
            ((vector<TypeInfo,_std::allocator<TypeInfo>_> *)local_68);
  ::std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_subgroup_arithmetic_workaround(const std::string &func, Op op, GroupOperation group_op)
{
	std::string result;
	switch (group_op)
	{
	case GroupOperationReduce:
		result = "reduction";
		break;

	case GroupOperationExclusiveScan:
		result = "excl_scan";
		break;

	case GroupOperationInclusiveScan:
		result = "incl_scan";
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	struct TypeInfo
	{
		std::string type;
		std::string identity;
	};

	std::vector<TypeInfo> type_infos;
	switch (op)
	{
	case OpGroupNonUniformIAdd:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "0u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(0u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(0u)" });
		type_infos.emplace_back(TypeInfo{ "int", "0" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(0)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(0)" });
		break;
	}

	case OpGroupNonUniformFAdd:
	{
		type_infos.emplace_back(TypeInfo{ "float", "0.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(0.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(0.0f)" });
		// ARB_gpu_shader_fp64 is required in GL4.0 which in turn is required by NV_thread_shuffle
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(0.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(0.0LF)" });
		break;
	}

	case OpGroupNonUniformIMul:
	{
		type_infos.emplace_back(TypeInfo{ "uint", "1u" });
		type_infos.emplace_back(TypeInfo{ "uvec2", "uvec2(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec3", "uvec3(1u)" });
		type_infos.emplace_back(TypeInfo{ "uvec4", "uvec4(1u)" });
		type_infos.emplace_back(TypeInfo{ "int", "1" });
		type_infos.emplace_back(TypeInfo{ "ivec2", "ivec2(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec3", "ivec3(1)" });
		type_infos.emplace_back(TypeInfo{ "ivec4", "ivec4(1)" });
		break;
	}

	case OpGroupNonUniformFMul:
	{
		type_infos.emplace_back(TypeInfo{ "float", "1.0f" });
		type_infos.emplace_back(TypeInfo{ "vec2", "vec2(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec3", "vec3(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "vec4", "vec4(1.0f)" });
		type_infos.emplace_back(TypeInfo{ "double", "0.0LF" });
		type_infos.emplace_back(TypeInfo{ "dvec2", "dvec2(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec3", "dvec3(1.0LF)" });
		type_infos.emplace_back(TypeInfo{ "dvec4", "dvec4(1.0LF)" });
		break;
	}

	default:
		SPIRV_CROSS_THROW("Unsupported workaround for arithmetic group operation");
	}

	const bool op_is_addition = op == OpGroupNonUniformIAdd || op == OpGroupNonUniformFAdd;
	const bool op_is_multiplication = op == OpGroupNonUniformIMul || op == OpGroupNonUniformFMul;
	std::string op_symbol;
	if (op_is_addition)
	{
		op_symbol = "+=";
	}
	else if (op_is_multiplication)
	{
		op_symbol = "*=";
	}

	for (const TypeInfo &t : type_infos)
	{
		statement(t.type, " ", func, "(", t.type, " v)");
		begin_scope();
		statement(t.type, " ", result, " = ", t.identity, ";");
		statement("uvec4 active_threads = subgroupBallot(true);");
		statement("if (subgroupBallotBitCount(active_threads) == gl_SubgroupSize)");
		begin_scope();
		statement("uint total = gl_SubgroupSize / 2u;");
		statement(result, " = v;");
		statement("for (uint i = 1u; i <= total; i <<= 1u)");
		begin_scope();
		statement("bool valid;");
		if (group_op == GroupOperationReduce)
		{
			statement(t.type, " s = shuffleXorNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		else if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement(t.type, " s = shuffleUpNV(", result, ", i, gl_SubgroupSize, valid);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement(result, " = shuffleUpNV(", result, ", 1u, gl_SubgroupSize);");
			statement("if (subgroupElect())");
			begin_scope();
			statement(result, " = ", t.identity, ";");
			end_scope();
		}
		end_scope();
		statement("else");
		begin_scope();
		if (group_op == GroupOperationExclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLtMask);");
		}
		else if (group_op == GroupOperationInclusiveScan)
		{
			statement("uint total = subgroupBallotBitCount(gl_SubgroupLeMask);");
		}
		statement("for (uint i = 0u; i < gl_SubgroupSize; ++i)");
		begin_scope();
		statement("bool valid = subgroupBallotBitExtract(active_threads, i);");
		statement(t.type, " s = shuffleNV(v, i, gl_SubgroupSize);");
		if (group_op == GroupOperationExclusiveScan || group_op == GroupOperationInclusiveScan)
		{
			statement("valid = valid && (i < total);");
		}
		if (op_is_addition || op_is_multiplication)
		{
			statement(result, " ", op_symbol, " valid ? s : ", t.identity, ";");
		}
		end_scope();
		end_scope();
		statement("return ", result, ";");
		end_scope();
	}
}